

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O0

int transport_worker_thread(void *threadArgument)

{
  LOCK_RESULT LVar1;
  TRANSPORT_HANDLE_DATA *transportData;
  void *threadArgument_local;
  
  do {
    LVar1 = Lock(*(LOCK_HANDLE *)((long)threadArgument + 0x10));
    if (LVar1 == LOCK_OK) {
      if (*(int *)((long)threadArgument + 0x18) != 0) {
        Unlock(*(LOCK_HANDLE *)((long)threadArgument + 0x10));
        ThreadAPI_Exit(0);
        return 0;
      }
      (**(code **)((long)threadArgument + 0x98))(*threadArgument);
      Unlock(*(LOCK_HANDLE *)((long)threadArgument + 0x10));
    }
    multiplexed_client_do_work((TRANSPORT_HANDLE_DATA *)threadArgument);
    ThreadAPI_Sleep(1);
  } while( true );
}

Assistant:

static int transport_worker_thread(void* threadArgument)
{
    TRANSPORT_HANDLE_DATA* transportData = (TRANSPORT_HANDLE_DATA*)threadArgument;

    while (1)
    {
        if (Lock(transportData->lockHandle) == LOCK_OK)
        {
            if (transportData->stopThread)
            {
                (void)Unlock(transportData->lockHandle);
                break;
            }
            else
            {
                (transportData->IoTHubTransport_DoWork)(transportData->transportLLHandle);

                (void)Unlock(transportData->lockHandle);
            }
        }

        multiplexed_client_do_work(transportData);

        ThreadAPI_Sleep(1);
    }

    ThreadAPI_Exit(0);
    return 0;
}